

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choice.c
# Opt level: O0

void choice_list(t_choice *x,t_symbol *s,int argc,t_atom *argv)

{
  t_float tVar1;
  double dVar2;
  float local_74;
  t_float sum;
  t_elem_conflict *e;
  t_float invec [10];
  int local_38;
  float local_34;
  int bestindex;
  t_float bestsum;
  int j;
  int i;
  t_atom *argv_local;
  int argc_local;
  t_symbol *s_local;
  t_choice *x_local;
  
  local_34 = 0.0;
  local_38 = -1;
  for (bestsum = 0.0; (int)bestsum < 10; bestsum = (t_float)((int)bestsum + 1)) {
    tVar1 = atom_getfloatarg((int)bestsum,argc,argv);
    invec[(long)(int)bestsum + -2] = tVar1;
  }
  for (bestindex = 0; bestindex < x->x_n; bestindex = bestindex + 1) {
    local_74 = 0.0;
    for (bestsum = 0.0; (int)bestsum < 10; bestsum = (t_float)((int)bestsum + 1)) {
      local_74 = x->x_vec[bestindex].e_weight[(int)bestsum] * invec[(long)(int)bestsum + -2] +
                 local_74;
    }
    if (x->x_nonrepeat != 0) {
      dVar2 = log((double)x->x_vec[bestindex].e_age);
      local_74 = (float)dVar2 * local_74;
    }
    if (local_34 < local_74) {
      local_34 = local_74;
      local_38 = bestindex;
    }
  }
  if (-1 < local_38) {
    for (bestindex = 0; bestindex < x->x_n; bestindex = bestindex + 1) {
      x->x_vec[bestindex].e_age = x->x_vec[bestindex].e_age + 1.0;
    }
    x->x_vec[local_38].e_age = 1.0;
  }
  outlet_float((x->x_obj).te_outlet,(float)local_38);
  return;
}

Assistant:

static void choice_list(t_choice *x, t_symbol *s, int argc, t_atom *argv)
{
    int i, j;
    t_float bestsum = 0;
    int bestindex = -1;
    t_float invec[DIMENSION];
    for (i = 0; i < DIMENSION; i++)
        invec[i] = atom_getfloatarg(i, argc, argv);
    for (j = 0; j < x->x_n; j++)
    {
        t_elem *e = x->x_vec + j;
        t_float sum;
        for (i = 0, sum = 0; i < DIMENSION; i++)
            sum += e->e_weight[i] * invec[i];
        if (x->x_nonrepeat) sum *= (t_float)(log(e->e_age));
        if (sum > bestsum)
        {
            bestsum = sum;
            sum = 1;
            bestindex = j;
        }
    }
    if (bestindex >= 0)
    {
        for (j = 0; j < x->x_n; j++)
            x->x_vec[j].e_age += 1.;
        x->x_vec[bestindex].e_age = 1;
    }
    outlet_float(x->x_obj.ob_outlet, (t_float)bestindex);
}